

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O3

Slice * __thiscall Imf_2_5::FrameBuffer::findSlice(FrameBuffer *this,string *name)

{
  iterator iVar1;
  Slice *pSVar2;
  key_type local_110;
  
  strncpy(local_110._text,(name->_M_dataplus)._M_p,0xff);
  local_110._text[0xff] = '\0';
  iVar1 = std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
          ::find((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                  *)this,&local_110);
  pSVar2 = (Slice *)0x0;
  if ((_Rb_tree_header *)iVar1._M_node != &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
    pSVar2 = (Slice *)(iVar1._M_node + 9);
  }
  return pSVar2;
}

Assistant:

Slice *
FrameBuffer::findSlice (const string &name)
{
    return findSlice (name.c_str());
}